

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

AnchorData ** __thiscall
QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*>::operator[]
          (QHash<QtGraphicsAnchorLayout::AnchorVertex_*,_QtGraphicsAnchorLayout::AnchorData_*> *this
          ,AnchorVertex **key)

{
  long in_FS_OFFSET;
  TryEmplaceResult local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*>::
  tryEmplace_impl<QtGraphicsAnchorLayout::AnchorVertex*const&>
            (&local_28,
             (QHash<QtGraphicsAnchorLayout::AnchorVertex*,QtGraphicsAnchorLayout::AnchorData*> *)
             this,key);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return (AnchorData **)
           ((local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].entries
            [(local_28.iterator.i.d)->spans[local_28.iterator.i.bucket >> 7].offsets
             [(uint)local_28.iterator.i.bucket & 0x7f]].storage.data + 8);
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        return *tryEmplace(key).iterator;
    }